

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O1

VerticalAlign
Rml::ComputeVerticalAlign
          (Property *property,float line_height,float font_size,float document_font_size,
          float dp_ratio,Vector2f vp_dimensions)

{
  Unit UVar1;
  code *pcVar2;
  bool bVar3;
  NumericValue value;
  ulong uVar4;
  float fVar5;
  float local_18;
  int local_14;
  
  UVar1 = property->unit;
  if ((UVar1 & LENGTH) == UNKNOWN) {
    if (UVar1 != KEYWORD) {
      if (UVar1 == PERCENT) {
        local_18 = 0.0;
        Variant::GetInto<float,_0>(&property->value,&local_18);
        fVar5 = line_height * local_18 * 0.01;
        goto LAB_001e6970;
      }
      bVar3 = Assert("RMLUI_ASSERT(property->unit == Unit::KEYWORD)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                     ,0xc6);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    local_14 = 0;
    Variant::GetInto<int,_0>(&property->value,&local_14);
    uVar4 = (ulong)(byte)local_14;
    fVar5 = 0.0;
  }
  else {
    value = Property::GetNumericValue(property);
    fVar5 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
LAB_001e6970:
    uVar4 = 9;
  }
  return (VerticalAlign)((ulong)(uint)fVar5 << 0x20 | uVar4);
}

Assistant:

Style::VerticalAlign ComputeVerticalAlign(const Property* property, float line_height, float font_size, float document_font_size, float dp_ratio,
	Vector2f vp_dimensions)
{
	if (Any(property->unit & Unit::LENGTH))
	{
		float value = ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions);
		return Style::VerticalAlign(value);
	}
	else if (property->unit == Unit::PERCENT)
	{
		return Style::VerticalAlign(property->Get<float>() * line_height * 0.01f);
	}

	RMLUI_ASSERT(property->unit == Unit::KEYWORD);
	return Style::VerticalAlign((Style::VerticalAlign::Type)property->Get<int>());
}